

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::
splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>>
::operator()(splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>>
             *this,value_type param_1,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *split,
            size_type *split_dim,scalar_type *split_val)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  anon_class_16_2_7d8a4650 __comp;
  anon_class_16_2_7d8a4650 __comp_00;
  scalar_type max_delta;
  float local_4c;
  splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>>
  *local_48;
  size_type *psStack_40;
  scalar_type *local_38;
  
  box_base<pico_tree::internal::box<float,_784UL>_>::max_side
            ((box_base<pico_tree::internal::box<float,_784UL>_> *)box,split_dim,&local_4c);
  *split_val = local_4c * 0.5 + (box->storage_).coords_min._M_elems[*split_dim];
  psStack_40 = split_dim;
  local_38 = split_val;
  local_48 = this;
  _Var1 = ::std::operator()(begin._M_current,end._M_current);
  split->_M_current = (int *)_Var1;
  if (_Var1._M_current == end._M_current) {
    split->_M_current = _Var1._M_current + -1;
    __comp_00.split_dim = split_dim;
    __comp_00.this =
         (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
          *)this;
    ::std::operator()(begin,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            (_Var1._M_current + -1),end,__comp_00);
  }
  else {
    if (_Var1._M_current != begin._M_current) {
      return;
    }
    split->_M_current = _Var1._M_current + 1;
    __comp.split_dim = split_dim;
    __comp.this = (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                   *)this;
    ::std::operator()(begin,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            (_Var1._M_current + 1),end,__comp);
  }
  *split_val = *(scalar_type *)((long)*split->_M_current * 0xc40 + **(long **)this + *split_dim * 4)
  ;
  return;
}

Assistant:

inline void operator()(
      typename std::iterator_traits<
          RandomAccessIterator_>::value_type const,  // depth
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type const& box,
      RandomAccessIterator_& split,
      size_type& split_dim,
      scalar_type& split_val) const {
    scalar_type max_delta;
    box.max_side(split_dim, max_delta);
    split_val = max_delta / scalar_type(2.0) + box.min(split_dim);

    // Everything smaller than split_val goes left, the rest right.
    auto const comp = [this, &split_dim, &split_val](auto const index) -> bool {
      return space_[index][split_dim] < split_val;
    };

    split = std::partition(begin, end, comp);

    // If it happens that either all points are on the left side or right
    // side, one point slides to the other side and we split on the first
    // right value instead of the middle split. In these two cases the split
    // value is unknown and a partial sort is required to obtain it, but also
    // to rearrange all other indices such that they are on their
    // corresponding left or right side.
    if (split == end) {
      split--;
      std::nth_element(
          begin,
          split,
          end,
          [this, &split_dim](auto const index_a, auto const index_b) -> bool {
            return space_[index_a][split_dim] < space_[index_b][split_dim];
          });
      split_val = space_[*split][split_dim];
    } else if (split == begin) {
      split++;
      std::nth_element(
          begin,
          split,
          end,
          [this, &split_dim](auto const index_a, auto const index_b) -> bool {
            return space_[index_a][split_dim] < space_[index_b][split_dim];
          });
      split_val = space_[*split][split_dim];
    }
  }